

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

void art_free_node(art_node_t *node)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  if (((ulong)node & 1) != 0) {
switchD_001107c0_default:
    return;
  }
  switch(*node) {
  case (art_node_t)0x0:
    for (uVar2 = 0; uVar2 < (byte)node[7]; uVar2 = uVar2 + 1) {
      art_free_node(*(art_node_t **)(node + uVar2 * 8 + 0x10));
    }
    break;
  case (art_node_t)0x1:
    for (uVar2 = 0; uVar2 < (byte)node[7]; uVar2 = uVar2 + 1) {
      art_free_node(*(art_node_t **)(node + uVar2 * 8 + 0x18));
    }
    break;
  case (art_node_t)0x2:
    for (uVar2 = *(ulong *)(node + 8) ^ 0xffffffffffff; uVar2 != 0;
        uVar2 = uVar2 & ~(1L << (uVar1 & 0x3f))) {
      uVar1 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      art_free_node(*(art_node_t **)(node + uVar1 * 8 + 0x110));
    }
    break;
  case (art_node_t)0x3:
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      if (*(art_node_t **)(node + lVar3 * 8 + 0x10) != (art_node_t *)0x0) {
        art_free_node(*(art_node_t **)(node + lVar3 * 8 + 0x10));
      }
    }
    break;
  default:
    goto switchD_001107c0_default;
  }
  roaring_free(node);
  return;
}

Assistant:

static void art_free_node(art_node_t *node) {
    if (art_is_leaf(node)) {
        // We leave it up to the user to free leaves.
        return;
    }
    switch (art_get_type((art_inner_node_t *)node)) {
        case ART_NODE4_TYPE:
            art_free_node4((art_node4_t *)node);
            break;
        case ART_NODE16_TYPE:
            art_free_node16((art_node16_t *)node);
            break;
        case ART_NODE48_TYPE:
            art_free_node48((art_node48_t *)node);
            break;
        case ART_NODE256_TYPE:
            art_free_node256((art_node256_t *)node);
            break;
        default:
            assert(false);
    }
}